

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O1

bool __thiscall opts::Options::parse(Options *this,int argc,char **argv)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  undefined1 uVar4;
  mapped_type pBVar5;
  mapped_type pBVar6;
  char *pcVar7;
  Options *this_00;
  bool bVar8;
  char cVar9;
  byte bVar10;
  int iVar11;
  mapped_type *ppBVar12;
  mapped_type *ppBVar13;
  _List_node_base *p_Var14;
  _Base_ptr p_Var15;
  long *plVar16;
  ostream *poVar17;
  iterator iVar18;
  size_t sVar19;
  _Base_ptr p_Var20;
  size_type *psVar21;
  char *pcVar22;
  undefined8 uVar23;
  _Alloc_hider _Var24;
  _Rb_tree_header *p_Var25;
  long lVar26;
  map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  short_opts;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
  long_opts;
  int local_1e4;
  allocator<char> local_1dd;
  int local_1dc;
  key_type local_1d8;
  _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  *local_1b8;
  undefined8 uStack_1b0;
  code *local_1a8;
  code *pcStack_1a0;
  _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  *local_198;
  undefined8 uStack_190;
  code *local_188;
  code *pcStack_180;
  _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  *local_178;
  undefined8 uStack_170;
  code *local_168;
  code *pcStack_160;
  _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  *local_158;
  undefined8 uStack_150;
  code *local_148;
  code *pcStack_140;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  string local_118;
  _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  local_f8;
  Options *local_c8;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
  local_60;
  
  local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8._M_impl.super__Rb_tree_header._M_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8 = this;
  p_Var14 = (this->options).
            super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  local_1dc = argc;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var14 != (_List_node_base *)&this->options) {
    do {
      pBVar5 = (mapped_type)p_Var14[1]._M_next;
      if (pBVar5->s != '\0') {
        ppBVar12 = std::
                   map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
                   ::operator[]((map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
                                 *)&local_f8,&pBVar5->s);
        *ppBVar12 = pBVar5;
      }
      pBVar6 = (mapped_type)p_Var14[1]._M_next;
      ppBVar13 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
                               *)&local_60,&pBVar6->l);
      *ppBVar13 = pBVar6;
      p_Var14 = p_Var14->_M_next;
    } while (p_Var14 != (_List_node_base *)&this->options);
  }
  this_00 = local_c8;
  local_1e4 = 1;
  if (1 < local_1dc) {
    do {
      cVar9 = *argv[local_1e4];
      if (cVar9 == '\0') goto LAB_001063c9;
      bVar8 = true;
      if (cVar9 == '-') {
        local_138._8_8_ = 0;
        local_138._M_unused._M_object = &local_f8;
        pcStack_120 = std::
                      _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/../opts.h:388:21)>
                      ::_M_invoke;
        local_128 = std::
                    _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/../opts.h:388:21)>
                    ::_M_manager;
        bVar8 = dashed_non_option(argv[local_1e4],(IsShort *)&local_138);
        if (local_128 != (code *)0x0) {
          (*local_128)(&local_138,&local_138,__destroy_functor);
        }
      }
      p_Var3 = &local_f8._M_impl.super__Rb_tree_header;
      paVar2 = &local_1d8.field_2;
      if (bVar8 == false) {
        pcVar7 = argv[local_1e4];
        cVar9 = pcVar7[1];
        if (cVar9 == '-') {
          if (pcVar7[2] == '\0') {
            while (local_1e4 = local_1e4 + 1, local_1e4 < local_1dc) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1d8,argv[local_1e4],&local_1dd);
              paVar2 = &local_1d8.field_2;
              p_Var14 = (_List_node_base *)operator_new(0x30);
              p_Var14[1]._M_next = p_Var14 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p == paVar2) {
                p_Var14[2]._M_next =
                     (_List_node_base *)
                     CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                              local_1d8.field_2._M_local_buf[0]);
                p_Var14[2]._M_prev = (_List_node_base *)local_1d8.field_2._8_8_;
              }
              else {
                p_Var14[1]._M_next = (_List_node_base *)local_1d8._M_dataplus._M_p;
                p_Var14[2]._M_next =
                     (_List_node_base *)
                     CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                              local_1d8.field_2._M_local_buf[0]);
              }
              p_Var14[1]._M_prev = (_List_node_base *)local_1d8._M_string_length;
              local_1d8._M_string_length = 0;
              local_1d8.field_2._M_local_buf[0] = '\0';
              local_1d8._M_dataplus._M_p = (pointer)paVar2;
              std::__detail::_List_node_base::_M_hook(p_Var14);
              psVar1 = &(this_00->args).
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl._M_node._M_size;
              *psVar1 = *psVar1 + 1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != paVar2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                         local_1d8.field_2._M_local_buf[0]) + 1);
              }
            }
          }
          else {
            lVar26 = 0;
            for (pcVar22 = pcVar7 + 2; (*pcVar22 != '\0' && (*pcVar22 != '='));
                pcVar22 = pcVar22 + 1) {
              lVar26 = lVar26 + -1;
            }
            if (lVar26 == 0) {
              this_00->failed = true;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_80,pcVar7,(allocator<char> *)&local_1d8);
              unrecognized_option(this_00,&local_80);
              uVar23 = local_80.field_2._M_allocated_capacity;
              _Var24._M_p = local_80._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) goto LAB_001063c1;
            }
            else {
              local_1d8._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char*>((string *)&local_1d8);
              iVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
                       ::find(&local_60,&local_1d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != paVar2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                         local_1d8.field_2._M_local_buf[0]) + 1);
              }
              if ((_Rb_tree_header *)iVar18._M_node == &local_60._M_impl.super__Rb_tree_header) {
                this_00->failed = true;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_a0,argv[local_1e4],(allocator<char> *)&local_1d8);
                unrecognized_option(this_00,&local_a0);
                uVar23 = local_a0.field_2._M_allocated_capacity;
                _Var24._M_p = local_a0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) goto LAB_001063c1;
              }
              else {
                uStack_150 = 0;
                local_158 = &local_f8;
                pcStack_140 = std::
                              _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/../opts.h:388:21)>
                              ::_M_invoke;
                local_148 = std::
                            _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/../opts.h:388:21)>
                            ::_M_manager;
                bVar10 = (**(code **)(**(long **)(iVar18._M_node + 2) + 0x18))
                                   (*(long **)(iVar18._M_node + 2),local_1dc,argv,&local_1e4,
                                    (((int)pcVar7 - *(int *)(argv + local_1e4)) - (int)lVar26) + 2,
                                    &local_158);
                this_00->failed = (bool)(this_00->failed | bVar10 ^ 1);
                if (local_148 != (code *)0x0) {
                  (*local_148)(&local_158,&local_158,3);
                }
              }
            }
          }
        }
        else {
          p_Var20 = &p_Var3->_M_header;
          p_Var15 = local_f8._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (cVar9 == '\0') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d8,pcVar7,&local_1dd);
            p_Var14 = (_List_node_base *)operator_new(0x30);
            goto LAB_0010635c;
          }
          for (; (_Rb_tree_header *)p_Var15 != (_Rb_tree_header *)0x0;
              p_Var15 = (&p_Var15->_M_left)[(char)*(size_t *)(p_Var15 + 1) < cVar9]) {
            if (cVar9 <= (char)*(size_t *)(p_Var15 + 1)) {
              p_Var20 = p_Var15;
            }
          }
          p_Var25 = p_Var3;
          if (((_Rb_tree_header *)p_Var20 != p_Var3) &&
             (p_Var25 = (_Rb_tree_header *)p_Var20,
             cVar9 < (char)((_Rb_tree_header *)p_Var20)->_M_node_count)) {
            p_Var25 = p_Var3;
          }
          if (p_Var25 == p_Var3) {
            this_00->failed = true;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,pcVar7,(allocator<char> *)&local_1d8);
            unrecognized_option(this_00,&local_c0);
            uVar23 = local_c0.field_2._M_allocated_capacity;
            _Var24._M_p = local_c0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) goto LAB_001063c1;
          }
          else {
            cVar9 = (**(code **)(**(long **)(p_Var25 + 1) + 0x10))();
            plVar16 = *(long **)(p_Var25 + 1);
            if (cVar9 == '\0') {
              uStack_1b0 = 0;
              local_1b8 = &local_f8;
              pcStack_1a0 = std::
                            _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/../opts.h:388:21)>
                            ::_M_invoke;
              local_1a8 = std::
                          _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/../opts.h:388:21)>
                          ::_M_manager;
              bVar10 = (**(code **)(*plVar16 + 0x18))
                                 (plVar16,local_1dc,argv,&local_1e4,2,&local_1b8);
              this_00->failed = (bool)(this_00->failed | bVar10 ^ 1);
              if (local_1a8 != (code *)0x0) {
                (*local_1a8)(&local_1b8,&local_1b8,3);
              }
            }
            else {
              uStack_170 = 0;
              local_178 = &local_f8;
              pcStack_160 = std::
                            _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/../opts.h:388:21)>
                            ::_M_invoke;
              local_168 = std::
                          _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/../opts.h:388:21)>
                          ::_M_manager;
              (**(code **)(*plVar16 + 0x18))(plVar16,local_1dc,argv,&local_1e4,0,&local_178);
              if (local_168 != (code *)0x0) {
                (*local_168)(&local_178,&local_178,3);
              }
              cVar9 = argv[local_1e4][1];
              if (cVar9 != '\0') {
                lVar26 = 1;
                do {
                  iVar11 = isprint((int)cVar9);
                  local_1d8._M_dataplus._M_p._0_1_ = cVar9;
                  if ((cVar9 == '-') || (iVar11 == 0)) {
                    this_00->failed = true;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"error: invalid character\'",0x19);
                    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,(char *)&local_1d8,1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar17," ignoring ",10);
                    pcVar7 = argv[local_1e4];
                    sVar19 = strlen(pcVar7 + lVar26);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar17,pcVar7 + lVar26,sVar19);
                    local_1d8._M_dataplus._M_p._0_1_ = 10;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar17,(char *)&local_1d8,1)
                    ;
                    break;
                  }
                  p_Var3 = &local_f8._M_impl.super__Rb_tree_header;
                  p_Var15 = &p_Var3->_M_header;
                  for (p_Var20 = local_f8._M_impl.super__Rb_tree_header._M_header._M_parent;
                      p_Var20 != (_Base_ptr)0x0; p_Var20 = (&p_Var20->_M_left)[(char)uVar4 < cVar9])
                  {
                    uVar4 = (undefined1)p_Var20[1]._M_color;
                    if (cVar9 <= (char)uVar4) {
                      p_Var15 = p_Var20;
                    }
                  }
                  p_Var20 = &p_Var3->_M_header;
                  if (((_Rb_tree_header *)p_Var15 != p_Var3) &&
                     (p_Var20 = p_Var15, cVar9 < (char)p_Var15[1]._M_color)) {
                    p_Var20 = &p_Var3->_M_header;
                  }
                  if ((_Rb_tree_header *)p_Var20 == p_Var3) {
                    this_00->failed = true;
                    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                    std::__cxx11::string::_M_construct((ulong)&local_1d8,'\x01');
                    plVar16 = (long *)std::__cxx11::string::replace
                                                ((ulong)&local_1d8,0,(char *)0x0,0x1305c7);
                    psVar21 = (size_type *)(plVar16 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar16 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar21) {
                      local_118.field_2._M_allocated_capacity = *psVar21;
                      local_118.field_2._8_8_ = plVar16[3];
                      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                    }
                    else {
                      local_118.field_2._M_allocated_capacity = *psVar21;
                      local_118._M_dataplus._M_p = (pointer)*plVar16;
                    }
                    local_118._M_string_length = plVar16[1];
                    *plVar16 = (long)psVar21;
                    plVar16[1] = 0;
                    *(undefined1 *)(plVar16 + 2) = 0;
                    unrecognized_option(this_00,&local_118);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != &local_118.field_2) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      local_118.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                      operator_delete(local_1d8._M_dataplus._M_p,
                                      CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                               local_1d8.field_2._M_local_buf[0]) + 1);
                    }
                  }
                  else {
                    cVar9 = (**(code **)(*(long *)p_Var20[1]._M_parent + 0x10))();
                    if (cVar9 == '\0') {
                      this_00->failed = true;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "error: non-void options not allowed in option packs; ignoring ",
                                 0x3e);
                      poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cerr,(char *)&local_1d8,1);
                      local_1d8._M_dataplus._M_p._0_1_ = 10;
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar17,(char *)&local_1d8,1);
                    }
                    else {
                      uStack_190 = 0;
                      local_198 = &local_f8;
                      pcStack_180 = std::
                                    _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/../opts.h:388:21)>
                                    ::_M_invoke;
                      local_188 = std::
                                  _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/../opts.h:388:21)>
                                  ::_M_manager;
                      (**(code **)(*(long *)p_Var20[1]._M_parent + 0x18))
                                (p_Var20[1]._M_parent,local_1dc,argv,&local_1e4,0,&local_198);
                      if (local_188 != (code *)0x0) {
                        (*local_188)(&local_198,&local_198,3);
                      }
                    }
                  }
                  cVar9 = argv[local_1e4][lVar26 + 1];
                  lVar26 = lVar26 + 1;
                } while (cVar9 != '\0');
              }
            }
          }
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d8,argv[local_1e4],&local_1dd);
        p_Var14 = (_List_node_base *)operator_new(0x30);
LAB_0010635c:
        p_Var14[1]._M_next = p_Var14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p == paVar2) {
          p_Var14[2]._M_next =
               (_List_node_base *)
               CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                        local_1d8.field_2._M_local_buf[0]);
          p_Var14[2]._M_prev = (_List_node_base *)local_1d8.field_2._8_8_;
        }
        else {
          p_Var14[1]._M_next = (_List_node_base *)local_1d8._M_dataplus._M_p;
          p_Var14[2]._M_next =
               (_List_node_base *)
               CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                        local_1d8.field_2._M_local_buf[0]);
        }
        p_Var14[1]._M_prev = (_List_node_base *)local_1d8._M_string_length;
        local_1d8._M_string_length = 0;
        local_1d8.field_2._M_local_buf[0] = '\0';
        local_1d8._M_dataplus._M_p = (pointer)paVar2;
        std::__detail::_List_node_base::_M_hook(p_Var14);
        psVar1 = &(this_00->args).
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar2) {
          uVar23 = CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                            local_1d8.field_2._M_local_buf[0]);
          _Var24._M_p = local_1d8._M_dataplus._M_p;
LAB_001063c1:
          operator_delete(_Var24._M_p,uVar23 + 1);
        }
      }
LAB_001063c9:
      local_1e4 = local_1e4 + 1;
    } while (local_1e4 < local_1dc);
  }
  bVar8 = this_00->failed;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  ::~_Rb_tree(&local_f8);
  return (bool)(bVar8 ^ 1);
}

Assistant:

bool
Options::parse(int argc, char** argv)
{
    std::map<char, BasicOption*>                    short_opts;
    std::map<std::string, BasicOption*>             long_opts;

    for (auto& opt : options)
    {
        if (opt->s)
            short_opts[opt->s] = opt.get();

        long_opts[opt->l] = opt.get();
    }

    auto is_short = [&short_opts](char c) -> bool   { return short_opts.find(c) != short_opts.end(); };

    for (int i = 1; i < argc; ++i)
    {
        if( argv[ i ][ 0 ] == '\0' )
            continue;
        if( argv[ i ][ 0 ] != '-' || dashed_non_option(argv[i], is_short))
            args.push_back(argv[i]);
        else
        {
            // -...
            if( argv[ i ][ 1 ] == '\0' )
            {
                // -
                args.push_back(argv[i]);
            } else if( argv[ i ][ 1 ] == '-' )
            {
                if( argv[ i ][ 2 ] == '\0' )
                {
                    // --
                    while( ++i < argc )
                        args.push_back(argv[i]);
                } else {
                    // --...
                    char* first = &argv[ i ][ 2 ];
                    char* last = first;
                    for(; *last != '=' && *last != '\0'; ++last);
                    if (first == last)
                    {
                        failed = true;
                        unrecognized_option(argv[i]);
                    } else
                    {
                        auto opt_it = long_opts.find(std::string{first,last});
                        if (opt_it == long_opts.end())
                        {
                            failed = true;
                            unrecognized_option(argv[i]);
                        } else
                        {
                            failed |= !opt_it->second->parse(argc, argv, i, static_cast<int>(last - argv[i]), is_short);
                        }
                    }
                }
            } else
            {
                // -f...
                auto opt_it = short_opts.find(argv[i][1]);
                if (opt_it == short_opts.end())
                {
                    failed = true;
                    unrecognized_option(argv[i]);
                } else if (opt_it->second->flag())
                {
                    opt_it->second->parse(argc, argv, i, 0, is_short);      // arguments are meaningless; just sets the flag

                    // -fgh
                    char c;
                    for(int j = 1; (c = argv[i][j]) != '\0'; ++j)
                    {
                        if (!std::isprint(c) || c == '-')
                        {
                            failed = true;
                            std::cerr << "error: invalid character\'" << c << " ignoring " << &argv[i][j] << '\n';
                            break;
                        }
                        opt_it = short_opts.find(c);
                        if (opt_it == short_opts.end())
                        {
                            failed = true;
                            unrecognized_option("-" + std::string(1, c));
                            continue;
                        }
                        if (!opt_it->second->flag())
                        {
                            failed = true;
                            std::cerr << "error: non-void options not allowed in option packs; ignoring " << c << '\n';
                            continue;
                        }
                        opt_it->second->parse(argc, argv, i, 0, is_short);     // arguments are meaningless; just sets the flag
                    }
                } else
                {
                    failed |= !opt_it->second->parse(argc, argv, i, 2, is_short);
                }
            }
        }
    }

    return !failed;
}